

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Phase.hpp
# Opt level: O0

SquareMatrix<std::complex<float>_> __thiscall
qclab::qgates::Phase<std::complex<float>_>::matrix(Phase<std::complex<float>_> *this)

{
  complex<float> in_RCX;
  complex<float> m01;
  data_type extraout_RDX;
  Phase<std::complex<float>_> *in_RSI;
  complex<float> m00;
  complex<float> in_R8;
  double __x;
  double __x_00;
  double dVar1;
  SquareMatrix<std::complex<float>_> SVar2;
  complex<float> local_38;
  complex<float> local_30;
  complex<float> local_28;
  complex<float> local_20 [2];
  Phase<std::complex<float>_> *this_local;
  
  m00._M_value = (_ComplexT_conflict)in_RSI;
  this_local = this;
  std::complex<float>::complex(local_20,1.0,0.0);
  std::complex<float>::complex(&local_28,0.0,0.0);
  std::complex<float>::complex(&local_30,0.0,0.0);
  __x_00 = cos(in_RSI,__x);
  dVar1 = sin(in_RSI,__x_00);
  std::complex<float>::complex(&local_38,SUB84(__x_00,0),SUB84(dVar1,0));
  dense::SquareMatrix<std::complex<float>_>::SquareMatrix
            ((SquareMatrix<std::complex<float>_> *)this,m00,m01,in_RCX,in_R8);
  SVar2.data_._M_t.
  super___uniq_ptr_impl<std::complex<float>,_std::default_delete<std::complex<float>[]>_>._M_t.
  super__Tuple_impl<0UL,_std::complex<float>_*,_std::default_delete<std::complex<float>[]>_>.
  super__Head_base<0UL,_std::complex<float>_*,_false>._M_head_impl =
       extraout_RDX._M_t.
       super___uniq_ptr_impl<std::complex<float>,_std::default_delete<std::complex<float>[]>_>._M_t.
       super__Tuple_impl<0UL,_std::complex<float>_*,_std::default_delete<std::complex<float>[]>_>.
       super__Head_base<0UL,_std::complex<float>_*,_false>._M_head_impl;
  SVar2.size_ = (size_type_conflict)this;
  return SVar2;
}

Assistant:

qclab::dense::SquareMatrix< T > matrix() const override {
          return qclab::dense::SquareMatrix< T >( T(1) , T(0) ,
                                                  T(0) , T( cos() , sin() ) ) ;
        }